

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadV128(BinaryReader *this,v128 *out_value,char *desc)

{
  Offset *pOVar1;
  uint8_t *puVar2;
  Offset OVar3;
  undefined8 uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  
  OVar3 = (this->state_).offset;
  if (this->read_end_ < OVar3 + 0x10) {
    PrintError(this,"unable to read %s: %s","v128",desc,in_R8,in_R9,OVar3);
    return (Result)Error;
  }
  puVar2 = (this->state_).data + OVar3;
  uVar4 = *(undefined8 *)(puVar2 + 8);
  *(undefined8 *)out_value->v = *(undefined8 *)puVar2;
  *(undefined8 *)(out_value->v + 8) = uVar4;
  pOVar1 = &(this->state_).offset;
  *pOVar1 = *pOVar1 + 0x10;
  return (Result)Ok;
}

Assistant:

Result BinaryReader::ReadV128(v128* out_value, const char* desc) {
  return ReadT(out_value, "v128", desc);
}